

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmUVJobServerClient.cxx
# Opt level: O1

void __thiscall anon_unknown.dwarf_671e2b::ImplPosix::SendToken(ImplPosix *this)

{
  _Atomic_word *p_Var1;
  int status;
  int iVar2;
  uv_stream_t *handle;
  long lVar3;
  uv_buf_t buf;
  weak_ptr<std::function<void_(int)>_> local_30;
  uv_buf_t local_20;
  
  if (this->Conn == None) {
    return;
  }
  local_20 = uv_buf_init(&SendToken::token,1);
  if (this->Conn == FDs) {
    lVar3 = 0x80;
  }
  else {
    if (this->Conn != FIFO) {
      handle = (uv_stream_t *)0x0;
      goto LAB_0025a576;
    }
    lVar3 = 0x90;
  }
  handle = ::cm::uv_pipe_ptr::operator_cast_to_uv_stream_s_
                     ((uv_pipe_ptr *)((long)&(this->super_Impl)._vptr_Impl + lVar3));
LAB_0025a576:
  local_30.super___weak_ptr<std::function<void_(int)>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this->OnWrite).super___shared_ptr<std::function<void_(int)>,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  local_30.super___weak_ptr<std::function<void_(int)>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (this->OnWrite).super___shared_ptr<std::function<void_(int)>,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
  if (local_30.super___weak_ptr<std::function<void_(int)>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_30.super___weak_ptr<std::function<void_(int)>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_weak_count =
           (local_30.super___weak_ptr<std::function<void_(int)>,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_weak_count + 1;
      UNLOCK();
    }
    else {
      (local_30.super___weak_ptr<std::function<void_(int)>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_weak_count =
           (local_30.super___weak_ptr<std::function<void_(int)>,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_weak_count + 1;
    }
  }
  status = ::cm::uv_write(handle,&local_20,1,&local_30);
  if (local_30.super___weak_ptr<std::function<void_(int)>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &(local_30.super___weak_ptr<std::function<void_(int)>,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_weak_count;
      iVar2 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar2 = (local_30.super___weak_ptr<std::function<void_(int)>,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_weak_count;
      (local_30.super___weak_ptr<std::function<void_(int)>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_weak_count = iVar2 + -1;
    }
    if (iVar2 == 1) {
      (*(local_30.super___weak_ptr<std::function<void_(int)>,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_vptr__Sp_counted_base[3])();
    }
  }
  if (status != 0) {
    Disconnect(this,status);
  }
  return;
}

Assistant:

void ImplPosix::SendToken()
{
  if (this->Conn == Connection::None) {
    return;
  }

  static char token = '.';

  uv_buf_t const buf = uv_buf_init(&token, sizeof(token));
  int status = cm::uv_write(this->GetWriter(), &buf, 1, this->OnWrite);
  if (status != 0) {
    this->Disconnect(status);
  }
}